

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btreeblock_test.cc
# Opt level: O0

int main(void)

{
  uint64_t in_stack_00000330;
  
  basic_test();
  iterator_test();
  two_btree_test();
  range_test();
  subblock_test();
  btree_reverse_iterator_test();
  btree_initial_load_test(in_stack_00000330);
  btree_initial_load_test(in_stack_00000330);
  return 0;
}

Assistant:

int main()
{
#ifdef _MEMPOOL
    mempool_init();
#endif

    basic_test();
    iterator_test();
    two_btree_test();
    range_test();
    subblock_test();
    btree_reverse_iterator_test();
    btree_initial_load_test(10);
    btree_initial_load_test(100000);

    return 0;
}